

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnitIndex.cpp
# Opt level: O1

bool __thiscall llvm::DWARFUnitIndex::parse(DWARFUnitIndex *this,DataExtractor IndexData)

{
  DWARFSectionKind *pDVar1;
  Entry *__ptr;
  bool bVar2;
  
  bVar2 = parseImpl(this,IndexData);
  if (!bVar2) {
    (this->Header).NumBuckets = 0;
    pDVar1 = (this->ColumnKinds)._M_t.
             super___uniq_ptr_impl<llvm::DWARFSectionKind,_std::default_delete<llvm::DWARFSectionKind[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_llvm::DWARFSectionKind_*,_std::default_delete<llvm::DWARFSectionKind[]>_>
             .super__Head_base<0UL,_llvm::DWARFSectionKind_*,_false>._M_head_impl;
    (this->ColumnKinds)._M_t.
    super___uniq_ptr_impl<llvm::DWARFSectionKind,_std::default_delete<llvm::DWARFSectionKind[]>_>.
    _M_t.
    super__Tuple_impl<0UL,_llvm::DWARFSectionKind_*,_std::default_delete<llvm::DWARFSectionKind[]>_>
    .super__Head_base<0UL,_llvm::DWARFSectionKind_*,_false>._M_head_impl = (DWARFSectionKind *)0x0;
    if (pDVar1 != (DWARFSectionKind *)0x0) {
      operator_delete__(pDVar1);
    }
    __ptr = (this->Rows)._M_t.
            super___uniq_ptr_impl<llvm::DWARFUnitIndex::Entry,_std::default_delete<llvm::DWARFUnitIndex::Entry[]>_>
            ._M_t.
            super__Tuple_impl<0UL,_llvm::DWARFUnitIndex::Entry_*,_std::default_delete<llvm::DWARFUnitIndex::Entry[]>_>
            .super__Head_base<0UL,_llvm::DWARFUnitIndex::Entry_*,_false>._M_head_impl;
    (this->Rows)._M_t.
    super___uniq_ptr_impl<llvm::DWARFUnitIndex::Entry,_std::default_delete<llvm::DWARFUnitIndex::Entry[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_llvm::DWARFUnitIndex::Entry_*,_std::default_delete<llvm::DWARFUnitIndex::Entry[]>_>
    .super__Head_base<0UL,_llvm::DWARFUnitIndex::Entry_*,_false>._M_head_impl = (Entry *)0x0;
    if (__ptr != (Entry *)0x0) {
      std::default_delete<llvm::DWARFUnitIndex::Entry[]>::operator()
                ((default_delete<llvm::DWARFUnitIndex::Entry[]> *)&this->Rows,__ptr);
    }
  }
  return bVar2;
}

Assistant:

bool DWARFUnitIndex::parse(DataExtractor IndexData) {
  bool b = parseImpl(IndexData);
  if (!b) {
    // Make sure we don't try to dump anything
    Header.NumBuckets = 0;
    // Release any partially initialized data.
    ColumnKinds.reset();
    Rows.reset();
  }
  return b;
}